

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::SomeHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  uint uVar1;
  ThreadContext *this;
  code *pcVar2;
  double value;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Var pvVar6;
  RecyclableObject *callBackFn;
  undefined4 *puVar7;
  undefined8 uVar8;
  JavascriptMethod p_Var9;
  uint64 uVar10;
  uint64 uVar11;
  long lVar12;
  char16_t *varName;
  ulong uVar13;
  ulong uVar14;
  undefined1 local_88 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_58;
  
  local_88 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_88)->noJsReentrancy;
  ((ThreadContext *)local_88)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_88,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b98c79:
    varName = L"[TypedArray].prototype.some";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.some";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar6 = Arguments::operator[](args,1);
  bVar3 = JavascriptConversion::IsCallable(pvVar6);
  if (!bVar3) goto LAB_00b98c79;
  pvVar6 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar6);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    local_58 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_58 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar3) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
      goto LAB_00b98a25;
    }
  }
  else {
LAB_00b98a25:
    if (typedArrayBase != (TypedArrayBase *)0x0) {
      bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (!bVar3) {
        bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x238b,"(VarIsCorrectType(typedArrayBase))",
                                      "VarIsCorrectType(typedArrayBase)");
          if (!bVar3) {
LAB_00b98d04:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        Throw::FatalInternalError(-0x7fffbffb);
      }
      uVar1 = (typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
      if (uVar1 < length) {
        length = uVar1;
      }
      lVar12 = 0x3f0;
      if (length != 0) {
        jsReentLock._24_8_ = typedArrayBase;
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        uVar13 = 0;
        do {
          uVar8 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x390))
                            (jsReentLock._24_8_,uVar13 & 0xffffffff);
          *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          this = scriptContext->threadContext;
          bVar3 = this->reentrancySafeOrHandled;
          this->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
          if (scriptContext->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var9 = RecyclableObject::GetEntryPoint(callBackFn);
          CheckIsExecutable(callBackFn,p_Var9);
          p_Var9 = RecyclableObject::GetEntryPoint(callBackFn);
          if ((int)uVar13 < 0) {
            value = (double)(uVar13 & 0xffffffff);
            uVar10 = NumberUtilities::ToSpecial(value);
            bVar4 = NumberUtilities::IsNan(value);
            if (bVar4) {
              uVar11 = NumberUtilities::ToSpecial(value);
              if (uVar11 != 0xfff8000000000000) {
                uVar11 = NumberUtilities::ToSpecial(value);
                if (uVar11 != 0x7ff8000000000000) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar7 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                              ,0xa2,
                                              "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                              ,"We should only produce a NaN with this value");
                  if (!bVar4) goto LAB_00b98d04;
                  *puVar7 = 0;
                }
              }
            }
            uVar14 = uVar10 ^ 0xfffc000000000000;
          }
          else {
            uVar14 = uVar13 + 0x1000000000000;
          }
          pvVar6 = (*p_Var9)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_58,
                             uVar8,uVar14,jsReentLock._24_8_);
          this->reentrancySafeOrHandled = bVar3;
          BVar5 = JavascriptConversion::ToBoolean(pvVar6,scriptContext);
          if (BVar5 != 0) {
            lVar12 = 1000;
            goto LAB_00b98c4c;
          }
          uVar13 = uVar13 + 1;
        } while (length != uVar13);
        lVar12 = 0x3f0;
      }
LAB_00b98c4c:
      pvVar6 = *(Var *)((long)&(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                               super_JavascriptLibraryBase).super_FinalizableObject.
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar12);
      goto LAB_00b98c58;
    }
  }
  *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar6 = SomeObjectHelper<unsigned_int>(obj,length,0,callBackFn,local_58,scriptContext);
LAB_00b98c58:
  *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar6;
}

Assistant:

Var JavascriptArray::SomeHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // We are in the TypedArray version of this API if and only if typedArrayBase != nullptr
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.some"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.some"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.some and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var element = nullptr;
        Var testResult = nullptr;

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);

                JS_REENTRANT_UNLOCK(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetTrue();
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SomeObjectHelper<T>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return scriptContext->GetLibrary()->GetFalse();
    }